

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall embree::Application::Application(Application *this,int features)

{
  CommandLineParser *this_00;
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *this_01;
  atomic<unsigned_long> *paVar2;
  double dVar3;
  CommandLineOption *pCVar4;
  mapped_type *pmVar5;
  runtime_error *this_02;
  allocator local_9a;
  allocator local_99;
  Ref<embree::CommandLineParser::CommandLineOption> closure;
  string local_90;
  key_type local_70;
  string local_50 [32];
  
  this->_vptr_Application = (_func_int **)&PTR__Application_0029ed10;
  std::__cxx11::string::string((string *)&this->rtcore,"",(allocator *)&local_90);
  this->verbosity = 0;
  this->features = features;
  this_00 = &this->commandLineParser;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       0;
  (this->commandLineParser).verbosity = NORMAL;
  this->log_delta = false;
  dVar3 = getSeconds();
  this->start_time = dVar3;
  this->last_time = dVar3;
  this->last_virtual_memory = 0;
  this->last_resident_memory = 0;
  if (instance == (Application *)0x0) {
    instance = this;
    std::__cxx11::string::string((string *)&local_70,"help",&local_99);
    std::__cxx11::string::string
              (local_50,"--help: prints help for all supported command line options",&local_9a);
    pCVar4 = (CommandLineOption *)::operator_new(0x38);
    std::__cxx11::string::string((string *)&local_90,local_50);
    CommandLineParser::CommandLineOption::CommandLineOption(pCVar4,&local_90);
    (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_0029ed48;
    pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
    LOCK();
    paVar2 = &(pCVar4->super_RefCount).refCounter;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    closure.ptr = pCVar4;
    std::__cxx11::string::~string((string *)&local_90);
    std::
    vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
    ::push_back(&this_00->commandLineOptionList,&closure);
    this_01 = &(this->commandLineParser).commandLineOptionMap;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
             ::operator[](this_01,&local_70);
    if (closure.ptr != (CommandLineOption *)0x0) {
      (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    if (pmVar5->ptr != (CommandLineOption *)0x0) {
      (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar5->ptr = closure.ptr;
    if (closure.ptr != (CommandLineOption *)0x0) {
      (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if ((features & 1U) != 0) {
      std::__cxx11::string::string((string *)&local_70,"rtcore",&local_99);
      std::__cxx11::string::string
                (local_50,"--rtcore <string>: uses <string> to configure Embree device",&local_9a);
      pCVar4 = (CommandLineOption *)::operator_new(0x38);
      std::__cxx11::string::string((string *)&local_90,local_50);
      CommandLineParser::CommandLineOption::CommandLineOption(pCVar4,&local_90);
      (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_0029ed98;
      pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar2 = &(pCVar4->super_RefCount).refCounter;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      closure.ptr = pCVar4;
      std::__cxx11::string::~string((string *)&local_90);
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_00->commandLineOptionList,&closure);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_01,&local_70);
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar5->ptr != (CommandLineOption *)0x0) {
        (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar5->ptr = closure.ptr;
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_70,"threads",&local_99);
      std::__cxx11::string::string(local_50,"--threads <int>: number of threads to use",&local_9a);
      pCVar4 = (CommandLineOption *)::operator_new(0x38);
      std::__cxx11::string::string((string *)&local_90,local_50);
      CommandLineParser::CommandLineOption::CommandLineOption(pCVar4,&local_90);
      (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_0029ede8;
      pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar2 = &(pCVar4->super_RefCount).refCounter;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      closure.ptr = pCVar4;
      std::__cxx11::string::~string((string *)&local_90);
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_00->commandLineOptionList,&closure);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_01,&local_70);
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar5->ptr != (CommandLineOption *)0x0) {
        (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar5->ptr = closure.ptr;
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_70,"affinity",&local_99);
      std::__cxx11::string::string(local_50,"--affinity: affinitize threads",&local_9a);
      pCVar4 = (CommandLineOption *)::operator_new(0x38);
      std::__cxx11::string::string((string *)&local_90,local_50);
      CommandLineParser::CommandLineOption::CommandLineOption(pCVar4,&local_90);
      (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_0029ee38;
      pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar2 = &(pCVar4->super_RefCount).refCounter;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      closure.ptr = pCVar4;
      std::__cxx11::string::~string((string *)&local_90);
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_00->commandLineOptionList,&closure);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_01,&local_70);
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar5->ptr != (CommandLineOption *)0x0) {
        (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar5->ptr = closure.ptr;
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_70,"set_affinity",&local_99);
      std::__cxx11::string::string
                (local_50,"--set_affinity <0/1>: enables or disables affinitizing of threads",
                 &local_9a);
      pCVar4 = (CommandLineOption *)::operator_new(0x38);
      std::__cxx11::string::string((string *)&local_90,local_50);
      CommandLineParser::CommandLineOption::CommandLineOption(pCVar4,&local_90);
      (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_0029ee88;
      pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar2 = &(pCVar4->super_RefCount).refCounter;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      closure.ptr = pCVar4;
      std::__cxx11::string::~string((string *)&local_90);
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_00->commandLineOptionList,&closure);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_01,&local_70);
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar5->ptr != (CommandLineOption *)0x0) {
        (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar5->ptr = closure.ptr;
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_90,"set_affinity",(allocator *)local_50);
      std::__cxx11::string::string((string *)&local_70,"set-affinity",(allocator *)&closure);
      CommandLineParser::registerOptionAlias(this_00,&local_90,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_70,"start_threads",&local_99);
      std::__cxx11::string::string
                (local_50,
                 "--start_threads <0/1>: starts threads at device creation time if set to 1",
                 &local_9a);
      pCVar4 = (CommandLineOption *)::operator_new(0x38);
      std::__cxx11::string::string((string *)&local_90,local_50);
      CommandLineParser::CommandLineOption::CommandLineOption(pCVar4,&local_90);
      (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_0029eed8;
      pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar2 = &(pCVar4->super_RefCount).refCounter;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      closure.ptr = pCVar4;
      std::__cxx11::string::~string((string *)&local_90);
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_00->commandLineOptionList,&closure);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_01,&local_70);
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar5->ptr != (CommandLineOption *)0x0) {
        (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar5->ptr = closure.ptr;
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_90,"start_threads",(allocator *)local_50);
      std::__cxx11::string::string((string *)&local_70,"start-threads",(allocator *)&closure);
      CommandLineParser::registerOptionAlias(this_00,&local_90,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_70,"verbose",&local_99);
      std::__cxx11::string::string(local_50,"--verbose <int>: sets verbosity level",&local_9a);
      pCVar4 = (CommandLineOption *)::operator_new(0x38);
      std::__cxx11::string::string((string *)&local_90,local_50);
      CommandLineParser::CommandLineOption::CommandLineOption(pCVar4,&local_90);
      (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_0029ef28;
      pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar2 = &(pCVar4->super_RefCount).refCounter;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      closure.ptr = pCVar4;
      std::__cxx11::string::~string((string *)&local_90);
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_00->commandLineOptionList,&closure);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_01,&local_70);
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar5->ptr != (CommandLineOption *)0x0) {
        (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar5->ptr = closure.ptr;
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_70,"delta",&local_99);
      std::__cxx11::string::string(local_50,"--delta: print delta numbers in log",&local_9a);
      pCVar4 = (CommandLineOption *)::operator_new(0x38);
      std::__cxx11::string::string((string *)&local_90,local_50);
      CommandLineParser::CommandLineOption::CommandLineOption(pCVar4,&local_90);
      (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_0029ef78;
      pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar2 = &(pCVar4->super_RefCount).refCounter;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      closure.ptr = pCVar4;
      std::__cxx11::string::~string((string *)&local_90);
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_00->commandLineOptionList,&closure);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_01,&local_70);
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar5->ptr != (CommandLineOption *)0x0) {
        (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar5->ptr = closure.ptr;
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_70,"isa",&local_99);
      std::__cxx11::string::string
                (local_50,
                 "--isa <string>: selects instruction set to use:\n  sse: select SSE codepath\n  sse2: select SSE2 codepath\n  sse3: select SSE3 codepath\n  ssse3: select SSSE3 codepath\n  sse4.1: select SSE4.1 codepath\n  sse4.2: select SSE4.2 codepath\n  avx: select AVX codepath\n  avxi: select AVXI codepath\n  avx2: select AVX2 codepath\n  avx512: select AVX512 codepath\n"
                 ,&local_9a);
      pCVar4 = (CommandLineOption *)::operator_new(0x38);
      std::__cxx11::string::string((string *)&local_90,local_50);
      CommandLineParser::CommandLineOption::CommandLineOption(pCVar4,&local_90);
      (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_0029efc8;
      pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar2 = &(pCVar4->super_RefCount).refCounter;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      closure.ptr = pCVar4;
      std::__cxx11::string::~string((string *)&local_90);
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&this_00->commandLineOptionList,&closure);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_01,&local_70);
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar5->ptr != (CommandLineOption *)0x0) {
        (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar5->ptr = closure.ptr;
      if (closure.ptr != (CommandLineOption *)0x0) {
        (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"internal error: application already created");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Application::Application(int features)
    : rtcore(""), verbosity(0),
      features((Features)features),
      log_delta(false),
      start_time(getSeconds()),
      last_time(start_time),
      last_virtual_memory(0),
      last_resident_memory(0)
  {
    if (instance)
      throw std::runtime_error("internal error: application already created");

    instance = this;

    registerOption("help", [this] (Ref<ParseStream> cin, const FileName& path) {
        printCommandLineHelp();
        exit(1);
      }, "--help: prints help for all supported command line options");

    if (features & FEATURE_RTCORE)
    {
      registerOption("rtcore", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += "," + cin->getString();
        }, "--rtcore <string>: uses <string> to configure Embree device");
    
      registerOption("threads", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",threads=" + toString(cin->getInt());
        }, "--threads <int>: number of threads to use");

      registerOption("affinity", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",set_affinity=1";
        }, "--affinity: affinitize threads");

      registerOption("set_affinity", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",set_affinity=" + cin->getString();
        }, "--set_affinity <0/1>: enables or disables affinitizing of threads");
      registerOptionAlias("set_affinity","set-affinity");

      registerOption("start_threads", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",start_threads=" + cin->getString();
        }, "--start_threads <0/1>: starts threads at device creation time if set to 1");
      registerOptionAlias("start_threads","start-threads");
      
      registerOption("verbose", [this] (Ref<ParseStream> cin, const FileName& path) {
          verbosity = cin->getInt();
          rtcore += ",verbose=" + toString(verbosity);
        }, "--verbose <int>: sets verbosity level");

      registerOption("delta", [this] (Ref<ParseStream> cin, const FileName& path) {
          log_delta = true;
        }, "--delta: print delta numbers in log");
      
      registerOption("isa", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",isa=" + cin->getString();
        }, "--isa <string>: selects instruction set to use:\n"
        "  sse: select SSE codepath\n"
        "  sse2: select SSE2 codepath\n"
        "  sse3: select SSE3 codepath\n"
        "  ssse3: select SSSE3 codepath\n"
        "  sse4.1: select SSE4.1 codepath\n"
        "  sse4.2: select SSE4.2 codepath\n"
        "  avx: select AVX codepath\n"
        "  avxi: select AVXI codepath\n"
        "  avx2: select AVX2 codepath\n"
        "  avx512: select AVX512 codepath\n");
    } 
  }